

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O2

string * to_string_abi_cxx11_(string *__return_storage_ptr__,ze_image_flag_t flag)

{
  allocator local_19;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_19);
  if ((flag & ZE_IMAGE_FLAG_KERNEL_WRITE) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((flag & ZE_IMAGE_FLAG_BIAS_UNCACHED) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const ze_image_flag_t flag) {
  std::string flags = "";
  if (flag & ZE_IMAGE_FLAG_KERNEL_WRITE) {
    flags.append("|ZE_IMAGE_FLAG_KERNEL_WRITE|");
  }
  if (flag & ZE_IMAGE_FLAG_BIAS_UNCACHED) {
    flags.append("|ZE_IMAGE_FLAG_BIAS_UNCACHED|");
  }

  return flags;
}